

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O3

void duckdb::CountStarFunction::Window<long>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t param_3,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  pointer pFVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  pointer pFVar4;
  long lVar5;
  idx_t i;
  ulong uVar6;
  
  pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar4 == pFVar1) {
    lVar5 = 0;
  }
  else {
    puVar2 = (partition->filter_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar5 = 0;
    do {
      uVar6 = pFVar4->start;
      uVar3 = pFVar4->end;
      if (puVar2 == (unsigned_long *)0x0) {
        lVar5 = (lVar5 - uVar6) + uVar3;
      }
      else if (uVar6 < uVar3) {
        do {
          lVar5 = lVar5 + (ulong)((puVar2[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0);
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      pFVar4 = pFVar4 + 1;
    } while (pFVar4 != pFVar1);
  }
  *(long *)(result->data + rid * 8) = lVar5;
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition, const_data_ptr_t,
	                   data_ptr_t l_state, const SubFrames &frames, Vector &result, idx_t rid) {
		D_ASSERT(partition.column_ids.empty());

		auto data = FlatVector::GetData<RESULT_TYPE>(result);
		RESULT_TYPE total = 0;
		for (const auto &frame : frames) {
			const auto begin = frame.start;
			const auto end = frame.end;

			// Slice to any filtered rows
			if (partition.filter_mask.AllValid()) {
				total += end - begin;
				continue;
			}
			for (auto i = begin; i < end; ++i) {
				total += partition.filter_mask.RowIsValid(i);
			}
		}
		data[rid] = total;
	}